

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::MethodDescriptorProto::MethodDescriptorProto
          (MethodDescriptorProto *this,MethodDescriptorProto *from)

{
  bool bVar1;
  InternalMetadataWithArena *this_00;
  string *psVar2;
  Arena *this_01;
  void *pvVar3;
  MethodDescriptorProto *in_RSI;
  undefined8 *in_RDI;
  Arena *in_stack_fffffffffffffea8;
  MethodDescriptorProto *in_stack_fffffffffffffeb0;
  undefined7 in_stack_fffffffffffffeb8;
  undefined1 in_stack_fffffffffffffebf;
  ArenaStringPtr *in_stack_fffffffffffffec0;
  Arena *in_stack_fffffffffffffef8;
  MethodOptions *in_stack_ffffffffffffff00;
  MethodDescriptorProto *this_02;
  
  Message::Message(&in_stack_fffffffffffffeb0->super_Message);
  *in_RDI = &PTR__MethodDescriptorProto_00963930;
  internal::InternalMetadataWithArena::InternalMetadataWithArena
            ((InternalMetadataWithArena *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  *(uint32 *)(in_RDI + 2) = (in_RSI->_has_bits_).has_bits_[0];
  internal::CachedSize::CachedSize((CachedSize *)0x51b724);
  this_00 = &in_RSI->_internal_metadata_;
  if (((uint)(this_00->
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ).ptr_ & 1) == 1) {
    if (((uint)(this_00->
               super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               ).ptr_ & 1) == 1) {
      internal::
      InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
      ::
      PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>::Container>
                ((InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
                  *)this_00);
    }
    else {
      internal::InternalMetadataWithArena::default_instance();
    }
    internal::InternalMetadataWithArena::DoMergeFrom
              ((InternalMetadataWithArena *)in_stack_fffffffffffffeb0,
               (UnknownFieldSet *)in_stack_fffffffffffffea8);
  }
  psVar2 = internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  internal::ArenaStringPtr::UnsafeSetDefault((ArenaStringPtr *)(in_RDI + 3),psVar2);
  bVar1 = _internal_has_name(in_RSI);
  if (bVar1) {
    internal::GetEmptyStringAlreadyInited_abi_cxx11_();
    _internal_name_abi_cxx11_((MethodDescriptorProto *)0x51b8e5);
    GetArenaNoVirtual(in_stack_fffffffffffffeb0);
    internal::ArenaStringPtr::Set
              (in_stack_fffffffffffffec0,
               (string *)CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8),
               (string *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  }
  this_02 = (MethodDescriptorProto *)(in_RDI + 4);
  psVar2 = internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  internal::ArenaStringPtr::UnsafeSetDefault((ArenaStringPtr *)this_02,psVar2);
  bVar1 = _internal_has_input_type(in_RSI);
  if (bVar1) {
    internal::GetEmptyStringAlreadyInited_abi_cxx11_();
    in_stack_ffffffffffffff00 =
         (MethodOptions *)_internal_input_type_abi_cxx11_((MethodDescriptorProto *)0x51b9dc);
    in_stack_fffffffffffffef8 = GetArenaNoVirtual(in_stack_fffffffffffffeb0);
    internal::ArenaStringPtr::Set
              (in_stack_fffffffffffffec0,
               (string *)CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8),
               (string *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  }
  psVar2 = internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  internal::ArenaStringPtr::UnsafeSetDefault((ArenaStringPtr *)(in_RDI + 5),psVar2);
  bVar1 = _internal_has_output_type(in_RSI);
  if (bVar1) {
    internal::GetEmptyStringAlreadyInited_abi_cxx11_();
    _internal_output_type_abi_cxx11_((MethodDescriptorProto *)0x51ba89);
    this_01 = GetArenaNoVirtual(in_stack_fffffffffffffeb0);
    internal::ArenaStringPtr::Set
              ((ArenaStringPtr *)this_01,
               (string *)CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8),
               (string *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  }
  bVar1 = _internal_has_options(this_02);
  if (bVar1) {
    pvVar3 = operator_new(0x50);
    MethodOptions::MethodOptions
              (in_stack_ffffffffffffff00,(MethodOptions *)in_stack_fffffffffffffef8);
    in_RDI[6] = pvVar3;
  }
  else {
    in_RDI[6] = 0;
  }
  memcpy(in_RDI + 7,&in_RSI->client_streaming_,2);
  return;
}

Assistant:

MethodDescriptorProto::MethodDescriptorProto(const MethodDescriptorProto& from)
  : ::PROTOBUF_NAMESPACE_ID::Message(),
      _internal_metadata_(nullptr),
      _has_bits_(from._has_bits_) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  name_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  if (from._internal_has_name()) {
    name_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), from._internal_name(),
      GetArenaNoVirtual());
  }
  input_type_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  if (from._internal_has_input_type()) {
    input_type_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), from._internal_input_type(),
      GetArenaNoVirtual());
  }
  output_type_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  if (from._internal_has_output_type()) {
    output_type_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), from._internal_output_type(),
      GetArenaNoVirtual());
  }
  if (from._internal_has_options()) {
    options_ = new PROTOBUF_NAMESPACE_ID::MethodOptions(*from.options_);
  } else {
    options_ = nullptr;
  }
  ::memcpy(&client_streaming_, &from.client_streaming_,
    static_cast<size_t>(reinterpret_cast<char*>(&server_streaming_) -
    reinterpret_cast<char*>(&client_streaming_)) + sizeof(server_streaming_));
  // @@protoc_insertion_point(copy_constructor:google.protobuf.MethodDescriptorProto)
}